

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_exceptions.cpp
# Opt level: O0

void executor_corun_1(uint W)

{
  uint in_EDI;
  size_t i;
  Taskflow taskflow2;
  Taskflow taskflow1;
  Executor executor;
  Taskflow *f;
  Executor *in_stack_fffffffffffffc78;
  future<void> *in_stack_fffffffffffffc80;
  Taskflow *in_stack_fffffffffffffc90;
  Executor *this;
  anon_class_16_2_9c7762b6 *in_stack_fffffffffffffcb0;
  FlowBuilder *in_stack_fffffffffffffcb8;
  ulong local_340;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffd58;
  size_t in_stack_fffffffffffffd60;
  Executor *in_stack_fffffffffffffd68;
  undefined1 local_150 [336];
  
  f = (Taskflow *)local_150;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)f,(nullptr_t)(ulong)in_EDI);
  tf::Executor::Executor
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x120bb4);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffc90);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffc90);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_exceptions_cpp:709:21),_nullptr>
            (in_stack_fffffffffffffcb8,(anon_class_1_0_00000001 *)in_stack_fffffffffffffcb0);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_exceptions_cpp:713:21),_nullptr>
            (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  tf::Executor::run(in_stack_fffffffffffffc78,f);
  std::future<void>::get(in_stack_fffffffffffffc80);
  tf::Future<void>::~Future((Future<void> *)f);
  tf::Taskflow::clear((Taskflow *)0x120c6f);
  tf::Taskflow::clear((Taskflow *)0x120c7e);
  for (local_340 = 0; local_340 < 100; local_340 = local_340 + 1) {
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_exceptions_cpp:723:23),_nullptr>
              (in_stack_fffffffffffffcb8,(anon_class_1_0_00000001 *)in_stack_fffffffffffffcb0);
  }
  this = (Executor *)(local_150 + 0x10);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_exceptions_cpp:732:21),_nullptr>
            (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  tf::Executor::run(in_stack_fffffffffffffc78,f);
  std::future<void>::get(in_stack_fffffffffffffc80);
  tf::Future<void>::~Future((Future<void> *)f);
  tf::Taskflow::~Taskflow(f);
  tf::Taskflow::~Taskflow(f);
  tf::Executor::~Executor(this);
  return;
}

Assistant:

void executor_corun_1(unsigned W) {
  
  tf::Executor executor(W);
  tf::Taskflow taskflow1;
  tf::Taskflow taskflow2;

  taskflow1.emplace([](){
    throw std::runtime_error("x");
  });

  taskflow2.emplace([&](){
    REQUIRE_THROWS_WITH_AS(executor.corun(taskflow1), "x", std::runtime_error);
  });

  executor.run(taskflow2).get();
  
  taskflow1.clear();
  taskflow2.clear();

  for(size_t i=0; i<100; i++) {
    taskflow1.emplace([](tf::Subflow& sf){
      for(size_t j=0; j<100; j++) {
        sf.emplace([&](){
          throw std::runtime_error("y");
        });
      }
    });
  }
  
  taskflow2.emplace([&](){
    REQUIRE_THROWS_WITH_AS(executor.corun(taskflow1), "y", std::runtime_error);
  });

  executor.run(taskflow2).get();
}